

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

int __thiscall cppcms::crypto::hmac::init(hmac *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  pointer pmVar2;
  size_t sVar3;
  char *pcVar4;
  reference pvVar5;
  reference __src;
  byte *pbVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> opad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ipad;
  uint block_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  uint local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  uint local_c;
  hmac *local_8;
  
  local_8 = this;
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453545);
  local_c = (*pmVar2->_vptr_message_digest[3])();
  local_29 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x453584);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type_conflict3 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4535b8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4535de);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type_conflict3 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x45360c);
  sVar3 = crypto::key::size(&this->key_);
  if (local_c < sVar3) {
    pmVar2 = std::
             unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                           *)0x453638);
    pcVar4 = crypto::key::data(&this->key_);
    sVar3 = crypto::key::size(&this->key_);
    (*pmVar2->_vptr_message_digest[4])(pmVar2,pcVar4,sVar3);
    pmVar2 = std::
             unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                           *)0x453685);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       (in_stack_ffffffffffffff10);
    (*pmVar2->_vptr_message_digest[5])(pmVar2,pvVar5);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       (in_stack_ffffffffffffff10);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                      (in_stack_ffffffffffffff10);
    pmVar2 = std::
             unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                           *)0x4536dc);
    uVar1 = (*pmVar2->_vptr_message_digest[2])();
    memcpy(pvVar5,__src,(ulong)uVar1);
  }
  else {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       (in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff20 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)crypto::key::data(&this->key_);
    sVar3 = crypto::key::size(&this->key_);
    memcpy(pvVar5,in_stack_ffffffffffffff20,sVar3);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                       (in_stack_ffffffffffffff10);
    pcVar4 = crypto::key::data(&this->key_);
    sVar3 = crypto::key::size(&this->key_);
    memcpy(pvVar5,pcVar4,sVar3);
  }
  for (local_60 = 0; local_60 < local_c; local_60 = local_60 + 1) {
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_28,(ulong)local_60);
    *pbVar6 = *pbVar6 ^ 0x36;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_58,(ulong)local_60);
    *pbVar6 = *pbVar6 ^ 0x5c;
  }
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            std::
            unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
            ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                          *)0x45387e);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(this_00);
  (**(code **)((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + 0x20))(this_00,pvVar5,local_c);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x4538ba);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(this_00);
  (*pmVar2->_vptr_message_digest[4])(pmVar2,pvVar5,(ulong)local_c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            (this_00,(size_type)pmVar2,(value_type_conflict3 *)0x45390c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            (this_00,(size_type)pmVar2,(value_type_conflict3 *)0x453934);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff20);
  return extraout_EAX;
}

Assistant:

void hmac::init()
	{
		unsigned const block_size = md_->block_size();
		std::vector<unsigned char> ipad(block_size,0);
		std::vector<unsigned char> opad(block_size,0);
		if(key_.size() > block_size) {
			md_->append(key_.data(),key_.size());
			md_->readout(&ipad.front());
			memcpy(&opad.front(),&ipad.front(),md_->digest_size());
		}
		else {
			memcpy(&ipad.front(),key_.data(),key_.size());
			memcpy(&opad.front(),key_.data(),key_.size());
		}
		for(unsigned i=0;i<block_size;i++) {
			ipad[i]^=0x36 ;
			opad[i]^=0x5c ;
		}
		md_opad_->append(&opad.front(),block_size);
		md_->append(&ipad.front(),block_size);
		ipad.assign(block_size,0);
		opad.assign(block_size,0);
	}